

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maker.h
# Opt level: O2

void __thiscall
bwt::PasswordMaker::PasswordMaker(PasswordMaker *this,string *configFileName,size_t threadNumber)

{
  logger *this_00;
  allocator<char> local_71;
  string local_70 [32];
  string local_50;
  
  *(undefined8 *)((long)&(this->_serialLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_serialLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_serialLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_serialLock).super___mutex_base._M_mutex + 8) = 0;
  (this->_serialLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->_serialFileName)._M_dataplus._M_p = (pointer)&(this->_serialFileName).field_2;
  (this->_serialFileName)._M_string_length = 0;
  (this->_serialFileName).field_2._M_local_buf[0] = '\0';
  ::std::operator+(&this->_configFileName,"./config/",configFileName);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&this->_configuration,(nullptr_t)0x0);
  ::std::__cxx11::string::string<std::allocator<char>>(local_70,"Main",&local_71);
  spdlog::stdout_color_mt<spdlog::synchronous_factory>
            ((string *)&this->_mainLogger,(color_mode)local_70);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::string<std::allocator<char>>(local_70,"Worker",&local_71);
  spdlog::stdout_color_mt<spdlog::synchronous_factory>
            ((string *)&this->_workerLogger,(color_mode)local_70);
  ::std::__cxx11::string::~string(local_70);
  ThreadPool::ThreadPool(&this->_threadPool,threadNumber);
  this_00 = (this->_workerLogger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"[%Y-%m-%d %H:%M:%S.%e] [%n] [%^%l%$] [id:%6t] %v",
             (allocator<char> *)local_70);
  spdlog::logger::set_pattern(this_00,&local_50,local);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

PasswordMaker(const std::string& configFileName, const std::size_t threadNumber = std::thread::hardware_concurrency()) :
		_configFileName(CONFIG_PATH + configFileName),
		_threadPool(threadNumber) {
		_workerLogger->set_pattern("[%Y-%m-%d %H:%M:%S.%e] [%n] [%^%l%$] [id:%6t] %v");
	}